

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int update_send_key(ptls_t *tls,ptls_buffer_t *_sendbuf,int request_update)

{
  size_t sVar1;
  ptls_buffer_t *buf;
  ulong body_size_00;
  int in_EDX;
  undefined8 in_RDI;
  undefined1 uVar2;
  ptls_t *unaff_retaddr;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  size_t sendbuf_orig_off;
  int ret;
  st_ptls_record_message_emitter_t emitter;
  size_t in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  void *src;
  ptls_buffer_t *in_stack_ffffffffffffff58;
  ptls_buffer_t *buf_00;
  undefined7 in_stack_ffffffffffffff68;
  ptls_buffer_t *in_stack_ffffffffffffff70;
  size_t sVar3;
  st_ptls_record_message_emitter_t *in_stack_ffffffffffffff78;
  long lVar4;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  int local_4c;
  ptls_buffer_t *local_48 [3];
  code *local_30;
  code *local_28;
  int local_14;
  int is_enc;
  
  is_enc = (int)((ulong)in_RDI >> 0x20);
  local_14 = in_EDX;
  init_record_message_emitter
            ((ptls_t *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  sVar1 = local_48[0]->off;
  local_4c = (*local_30)(local_48);
  buf = local_48[0];
  if ((local_4c == 0) &&
     (local_4c = ptls_buffer__do_pushv
                           (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff48), local_4c == 0)) {
    lVar4 = 3;
    src = (void *)0x3;
    buf_00 = buf;
    local_4c = ptls_buffer__do_pushv(buf,(void *)0x3,in_stack_ffffffffffffff48);
    if (local_4c == 0) {
      sVar3 = buf->off;
      uVar2 = local_14 != 0;
      local_4c = ptls_buffer__do_pushv(buf_00,src,in_stack_ffffffffffffff48);
      if (local_4c == 0) {
        body_size_00 = buf->off - sVar3;
        if (lVar4 == -1) {
          local_4c = ptls_buffer__adjust_quic_blocksize
                               ((ptls_buffer_t *)CONCAT17(uVar2,in_stack_ffffffffffffff68),
                                body_size_00);
          if (local_4c != 0) goto LAB_00111b78;
        }
        else {
          for (; lVar4 != 0; lVar4 = lVar4 + -1) {
            buf->base[sVar3 - lVar4] =
                 (uint8_t)(body_size_00 >> (((char)lVar4 + -1) * '\b' & 0x3fU));
          }
        }
        local_4c = (*local_28)(local_48);
        if ((local_4c == 0) && (local_4c = update_traffic_key(unaff_retaddr,is_enc), local_4c == 0))
        {
          local_4c = 0;
        }
      }
    }
  }
LAB_00111b78:
  if (local_4c != 0) {
    local_48[0]->off = sVar1;
  }
  return local_4c;
}

Assistant:

static int update_send_key(ptls_t *tls, ptls_buffer_t *_sendbuf, int request_update)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    ptls_push_message(&emitter.super, NULL, PTLS_HANDSHAKE_TYPE_KEY_UPDATE,
                      { ptls_buffer_push(emitter.super.buf, !!request_update); });
    if ((ret = update_traffic_key(tls, 1)) != 0)
        goto Exit;
    ret = 0;

Exit:
    if (ret != 0)
        emitter.super.buf->off = sendbuf_orig_off;
    return ret;
}